

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O3

int __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::init(ZlibCompressor *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  invalid_argument aiStack_58 [16];
  source_location local_48;
  
  deflateEnd(&this->zs);
  (this->zs).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_in = 0;
  (this->zs).total_in = 0;
  (this->zs).next_out = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_out = 0;
  (this->zs).total_out = 0;
  (this->zs).msg = (char *)0x0;
  (this->zs).state = (internal_state *)0x0;
  (this->zs).zalloc = (alloc_func)0x0;
  (this->zs).zfree = (free_func)0x0;
  (this->zs).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->zs).data_type = 0;
  (this->zs).adler = 0;
  (this->zs).reserved = 0;
  iVar1 = deflateInit2_(&this->zs,(int)ctx,8,-in_EDX,in_ECX,in_R8D,"1.2.11",0x70);
  if (iVar1 == 0) {
    return 0;
  }
  std::invalid_argument::invalid_argument(aiStack_58,"zlib compressor: bad arg");
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
  ;
  local_48.function_ =
       "virtual void boost::deflate::deflate_stream_test::ZlibCompressor::init(int, int, int, int)";
  local_48.line_ = 0x4a;
  local_48.column_ = 0;
  throw_exception<std::invalid_argument>(aiStack_58,&local_48);
}

Assistant:

void init(
            int level,
            int windowBits,
            int memLevel,
            int strategy) override
        {
            deflateEnd(&zs);
            zs = {};
            const auto res = deflateInit2(&zs, level, Z_DEFLATED, -windowBits, memLevel, strategy);
            if(res != Z_OK)
               BOOST_THROW_EXCEPTION(std::invalid_argument{"zlib compressor: bad arg"});
        }